

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

int test_wildcard(char *name,_Bool cmdline)

{
  int iVar1;
  int local_fc;
  undefined1 auStack_f8 [4];
  int ret;
  glob_t globbed;
  stat statbuf;
  _Bool cmdline_local;
  char *name_local;
  
  iVar1 = stat(name,(stat *)&globbed.gl_stat);
  if (iVar1 == 0) {
    name_local._4_4_ = 1;
  }
  else if (cmdline) {
    name_local._4_4_ = 0;
  }
  else {
    local_fc = 0;
    iVar1 = glob(name,1,(__errfunc *)0x0,(glob_t *)auStack_f8);
    if (iVar1 == 0) {
      if (_auStack_f8 != 0) {
        local_fc = 2;
      }
      globfree((glob_t *)auStack_f8);
    }
    name_local._4_4_ = local_fc;
  }
  return name_local._4_4_;
}

Assistant:

int test_wildcard(const char *name, bool cmdline)
{
    struct stat statbuf;

    if (stat(name, &statbuf) == 0) {
        return WCTYPE_FILENAME;
    } else if (cmdline) {
        /*
         * On Unix, we never need to parse wildcards coming from
         * the command line, because the shell will have expanded
         * them into a filename list already.
         */
        return WCTYPE_NONEXISTENT;
    } else {
#if HAVE_GLOB_H
        glob_t globbed;
        int ret = WCTYPE_NONEXISTENT;

        if (glob(name, GLOB_ERR, NULL, &globbed) == 0) {
            if (globbed.gl_pathc > 0)
                ret = WCTYPE_WILDCARD;
            globfree(&globbed);
        }

        return ret;
#else
        /* On a system without glob.h, we just have to return a
         * failure code */
        return WCTYPE_NONEXISTENT;
#endif
    }
}